

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O1

void cali_channel_push_snapshot
               (cali_id_t chn_id,int param_2,int n,cali_id_t *trigger_info_attr_list,
               cali_variant_t *trigger_info_val_list)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  Attribute AVar5;
  uint uVar6;
  long lVar7;
  SnapshotView trigger_info_00;
  Channel channel;
  Caliper c;
  Attribute attr [64];
  Variant data [64];
  FixedSizeSnapshotRecord<64UL> trigger_info;
  undefined1 local_c90 [56];
  Attribute local_c58 [64];
  Variant local_a58 [64];
  Entry local_650 [64];
  SnapshotBuilder local_50;
  
  local_c90._16_8_ = chn_id;
  cali::Caliper::Caliper((Caliper *)(local_c90 + 0x18));
  memset(local_c58,0,0x200);
  memset(local_a58,0,0x400);
  uVar6 = 0;
  if (0 < n) {
    uVar6 = n;
  }
  uVar4 = 0x40;
  if ((int)uVar6 < 0x40) {
    uVar4 = uVar6;
  }
  if (0 < n) {
    lVar7 = 0;
    do {
      AVar5 = cali::Caliper::get_attribute
                        ((Caliper *)(local_c90 + 0x18),
                         *(cali_id_t *)((long)trigger_info_attr_list + lVar7));
      *(Node **)((long)&local_c58[0].m_node + lVar7) = AVar5.m_node;
      puVar1 = (undefined8 *)((long)&trigger_info_val_list->type_and_size + lVar7 * 2);
      uVar2 = puVar1[1];
      *(undefined8 *)((long)&local_a58[0].m_v.type_and_size + lVar7 * 2) = *puVar1;
      *(undefined8 *)((long)&local_a58[0].m_v.value + lVar7 * 2) = uVar2;
      lVar7 = lVar7 + 8;
    } while ((ulong)uVar4 * 8 - lVar7 != 0);
  }
  memset(local_650,0,0x600);
  local_50.m_capacity = 0x40;
  local_50.m_len = 0;
  local_50.m_skipped = 0;
  local_50.m_data = local_650;
  cali::Caliper::make_record
            ((Caliper *)(local_c90 + 0x18),(ulong)uVar4,local_c58,local_a58,&local_50,(Node *)0x0);
  cali::Caliper::get_channel((Caliper *)local_c90,(cali_id_t)(local_c90 + 0x18));
  if (((GlobalData *)local_c90._8_8_ != (GlobalData *)0x0) &&
     (0 < *(_Atomic_word *)(local_c90._8_8_ + 8))) {
    bVar3 = cali::Channel::is_active((Channel *)local_c90);
    if (bVar3) {
      trigger_info_00.m_len = local_50.m_len;
      trigger_info_00.m_data = local_50.m_data;
      cali::Caliper::push_snapshot
                ((Caliper *)(local_c90 + 0x18),(ChannelBody *)local_c90._0_8_,trigger_info_00);
    }
  }
  cali::Channel::~Channel((Channel *)local_c90);
  return;
}

Assistant:

void cali_channel_push_snapshot(
    cali_id_t chn_id,
    int /*scope*/,
    int                  n,
    const cali_id_t      trigger_info_attr_list[],
    const cali_variant_t trigger_info_val_list[]
)
{
    Caliper c;

    Attribute attr[64];
    Variant   data[64];

    n = std::min(std::max(n, 0), 64);

    for (int i = 0; i < n; ++i) {
        attr[i] = c.get_attribute(trigger_info_attr_list[i]);
        data[i] = Variant(trigger_info_val_list[i]);
    }

    FixedSizeSnapshotRecord<64> trigger_info;
    c.make_record(n, attr, data, trigger_info.builder());

    Channel channel = c.get_channel(chn_id);

    if (channel && channel.is_active())
        c.push_snapshot(channel.body(), trigger_info.view());
}